

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

qsizetype QLocaleData::findLocaleIndex(QLocaleId lid)

{
  undefined8 uVar1;
  QLocaleId localeId;
  QLocaleId QVar2;
  ulong uVar3;
  long lVar4;
  ushort uVar5;
  ushort uVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QLocaleId likelyId;
  QVarLengthArray<QLocaleId,_6LL> tried;
  QLocaleId local_90;
  undefined8 local_88;
  QLocaleId local_80;
  undefined1 local_78 [24];
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = lid.language_id;
  local_88._0_4_ = lid._0_4_;
  uVar5 = lid.territory_id;
  local_88._4_4_ = CONCAT22(local_88._6_2_,uVar5);
  local_90.language_id = 0xaaaa;
  local_90.script_id = 0xaaaa;
  local_90.territory_id = 0xaaaa;
  localeId = QLocaleId::withLikelySubtagsAdded((QLocaleId *)&local_88);
  local_90._0_4_ = localeId._0_4_;
  local_90.territory_id = localeId.territory_id;
  uVar3 = findLocaleIndexById(localeId);
  if (-1 < (long)uVar3) goto LAB_0030eaf6;
  local_78._16_8_ = &puStack_60;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = 6;
  local_78._8_8_ = 0;
  QVLABase<QLocaleId>::emplace_back_impl<QLocaleId_const&>
            ((QVLABase<QLocaleId> *)local_78,6,(void *)local_78._16_8_,&local_90);
  uVar1 = local_78._8_8_;
  bVar7 = local_78._8_8_ != 0;
  if (bVar7) {
    lVar4 = local_78._8_8_ * 6;
    bVar7 = true;
    do {
      if (((*(short *)(local_78._16_8_ + lVar4 + -6) == (short)(uint)local_88) &&
          ((uint)local_88 >> 0x10 == (uint)*(ushort *)(local_78._16_8_ + lVar4 + -4))) &&
         ((uint)*(ushort *)(local_78._16_8_ + lVar4 + -2) == (local_88._4_4_ & 0xffff))) break;
      lVar4 = lVar4 + -6;
      bVar7 = lVar4 != 0;
    } while (bVar7);
  }
  if (bVar7) {
LAB_0030e81b:
    if ((uVar5 != 0) && (uVar6 != 0 || lid.script_id != 0)) {
      local_88._4_4_ = local_88._4_4_ & 0xffff0000;
      QVar2 = QLocaleId::withLikelySubtagsAdded((QLocaleId *)&local_88);
      local_90._0_4_ = QVar2._0_4_;
      local_90.territory_id = QVar2.territory_id;
      bVar7 = local_78._8_8_ != 0;
      if (bVar7) {
        lVar4 = local_78._8_8_ * 6;
        bVar7 = true;
        do {
          if (((*(ushort *)(local_78._16_8_ + lVar4 + -6) == QVar2.language_id) &&
              ((uint)local_90._0_4_ >> 0x10 == (uint)*(ushort *)(local_78._16_8_ + lVar4 + -4))) &&
             (*(ushort *)(local_78._16_8_ + lVar4 + -2) == local_90.territory_id)) break;
          lVar4 = lVar4 + -6;
          bVar7 = lVar4 != 0;
        } while (bVar7);
      }
      if (!bVar7) {
        uVar3 = findLocaleIndexById(QVar2);
        if (-1 < (long)uVar3) goto LAB_0030ead6;
        QVarLengthArray<QLocaleId,_6LL>::push_back
                  ((QVarLengthArray<QLocaleId,_6LL> *)local_78,&local_90);
      }
      bVar7 = local_78._8_8_ != 0;
      if (bVar7) {
        lVar4 = local_78._8_8_ * 6;
        bVar7 = true;
        do {
          if (((*(short *)(local_78._16_8_ + lVar4 + -6) == (short)(uint)local_88) &&
              ((uint)local_88 >> 0x10 == (uint)*(ushort *)(local_78._16_8_ + lVar4 + -4))) &&
             ((uint)*(ushort *)(local_78._16_8_ + lVar4 + -2) == (local_88._4_4_ & 0xffff))) break;
          lVar4 = lVar4 + -6;
          bVar7 = lVar4 != 0;
        } while (bVar7);
      }
      if (!bVar7) {
        uVar3 = findLocaleIndexById((QLocaleId)
                                    ((uint6)local_88._4_4_ << 0x20 | (uint6)(uint)local_88));
        if (-1 < (long)uVar3) goto LAB_0030ead6;
        QVarLengthArray<QLocaleId,_6LL>::push_back
                  ((QVarLengthArray<QLocaleId,_6LL> *)local_78,(QLocaleId *)&local_88);
      }
    }
    if ((uVar5 != 0 || uVar6 != 0) && lid.script_id != 0) {
      local_88._0_4_ = (uint)uVar6;
      local_88._4_4_ = CONCAT22(local_88._6_2_,uVar5);
      QVar2 = QLocaleId::withLikelySubtagsAdded((QLocaleId *)&local_88);
      uVar1 = local_78._8_8_;
      local_90._0_4_ = QVar2._0_4_;
      local_90.territory_id = QVar2.territory_id;
      bVar7 = local_78._8_8_ != 0;
      if (bVar7) {
        lVar4 = local_78._8_8_ * 6;
        bVar7 = true;
        do {
          if (((*(ushort *)(local_78._16_8_ + lVar4 + -6) == QVar2.language_id) &&
              ((uint)local_90._0_4_ >> 0x10 == (uint)*(ushort *)(local_78._16_8_ + lVar4 + -4))) &&
             (*(ushort *)(local_78._16_8_ + lVar4 + -2) == local_90.territory_id)) break;
          lVar4 = lVar4 + -6;
          bVar7 = lVar4 != 0;
        } while (bVar7);
      }
      if (!bVar7) {
        uVar3 = findLocaleIndexById(QVar2);
        if (-1 < (long)uVar3) goto LAB_0030ead6;
        if (uVar1 == local_78._0_8_) {
          local_80.territory_id = local_90.territory_id;
          local_80.language_id = local_90.language_id;
          local_80.script_id = local_90.script_id;
          QVLABase<QLocaleId>::emplace_back_impl<QLocaleId>
                    ((QVLABase<QLocaleId> *)local_78,6,&puStack_60,&local_80);
        }
        else {
          QVLABase<QLocaleId>::emplace_back_impl<QLocaleId_const&>
                    ((QVLABase<QLocaleId> *)local_78,6,&puStack_60,&local_90);
        }
      }
      bVar7 = local_78._8_8_ != 0;
      if (bVar7) {
        lVar4 = local_78._8_8_ * 6;
        bVar7 = true;
        do {
          if (((*(short *)(local_78._16_8_ + lVar4 + -6) == (short)(uint)local_88) &&
              ((uint)local_88 >> 0x10 == (uint)*(ushort *)(local_78._16_8_ + lVar4 + -4))) &&
             ((uint)*(ushort *)(local_78._16_8_ + lVar4 + -2) == (local_88._4_4_ & 0xffff))) break;
          lVar4 = lVar4 + -6;
          bVar7 = lVar4 != 0;
        } while (bVar7);
      }
      if (!bVar7) {
        uVar3 = findLocaleIndexById((QLocaleId)
                                    ((uint6)local_88._4_4_ << 0x20 | (uint6)(uint)local_88));
        if (-1 < (long)uVar3) goto LAB_0030ead6;
        QVarLengthArray<QLocaleId,_6LL>::push_back
                  ((QVarLengthArray<QLocaleId,_6LL> *)local_78,(QLocaleId *)&local_88);
      }
    }
    uVar3 = (ulong)locale_index[(ulong)(uint6)localeId & 0xffff];
  }
  else {
    uVar3 = findLocaleIndexById((QLocaleId)((uint6)local_88._4_4_ << 0x20 | (uint6)(uint)local_88));
    if ((long)uVar3 < 0) {
      if (uVar1 == local_78._0_8_) {
        local_80.territory_id = local_88._4_2_;
        local_80.language_id = (undefined2)local_88;
        local_80.script_id = local_88._2_2_;
        QVLABase<QLocaleId>::emplace_back_impl<QLocaleId>
                  ((QVLABase<QLocaleId> *)local_78,6,&puStack_60,&local_80);
      }
      else {
        QVLABase<QLocaleId>::emplace_back_impl<QLocaleId_const&>
                  ((QVLABase<QLocaleId> *)local_78,6,&puStack_60,(QLocaleId *)&local_88);
      }
      goto LAB_0030e81b;
    }
  }
LAB_0030ead6:
  if ((undefined1 **)local_78._16_8_ != &puStack_60) {
    QtPrivate::sizedFree((void *)local_78._16_8_,local_78._0_8_ * 6);
  }
LAB_0030eaf6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar3;
}

Assistant:

qsizetype QLocaleData::findLocaleIndex(QLocaleId lid) noexcept
{
    QLocaleId localeId = lid;
    QLocaleId likelyId = localeId.withLikelySubtagsAdded();
    const ushort fallback = likelyId.language_id;

    // Try a straight match with the likely data:
    qsizetype index = findLocaleIndexById(likelyId);
    if (index >= 0)
        return index;
    QVarLengthArray<QLocaleId, 6> tried;
    tried.push_back(likelyId);

#define CheckCandidate(id) do { \
        if (!tried.contains(id)) { \
            index = findLocaleIndexById(id); \
            if (index >= 0) \
                return index; \
            tried.push_back(id); \
        } \
    } while (false) // end CheckCandidate

    // No match; try again with raw data:
    CheckCandidate(localeId);

    // No match; try again with likely country for language_script
    if (lid.territory_id && (lid.language_id || lid.script_id)) {
        localeId.territory_id = 0;
        likelyId = localeId.withLikelySubtagsAdded();
        CheckCandidate(likelyId);

        // No match; try again with any country
        CheckCandidate(localeId);
    }

    // No match; try again with likely script for language_region
    if (lid.script_id && (lid.language_id || lid.territory_id)) {
        localeId = QLocaleId { lid.language_id, 0, lid.territory_id };
        likelyId = localeId.withLikelySubtagsAdded();
        CheckCandidate(likelyId);

        // No match; try again with any script
        CheckCandidate(localeId);
    }
#undef CheckCandidate

    // No match; return base index for initial likely language:
    return locale_index[fallback];
}